

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_fix_dp(DisasContext_conflict1 *s,arg_VCVT_fix_dp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 var;
  TCGv_ptr arg3;
  TCGv_i32 arg2;
  int32_t local_48;
  int frac_bits;
  TCGv_ptr fpst;
  TCGv_i32 shift;
  TCGv_i64 vd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_fix_dp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v3(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || ((a->vd & 0x10U) == 0)) {
      _Var1 = vfp_access_check(s);
      if (_Var1) {
        if ((a->opc & 1U) == 0) {
          local_48 = 0x10 - a->imm;
        }
        else {
          local_48 = 0x20 - a->imm;
        }
        var = tcg_temp_new_i64(tcg_ctx_00);
        neon_load_reg64(tcg_ctx_00,var,a->vd);
        arg3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
        arg2 = tcg_const_i32_aarch64(tcg_ctx_00,local_48);
        switch(a->opc) {
        case 0:
          gen_helper_vfp_shtod(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 1:
          gen_helper_vfp_sltod(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 2:
          gen_helper_vfp_uhtod(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 3:
          gen_helper_vfp_ultod(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 4:
          gen_helper_vfp_toshd_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 5:
          gen_helper_vfp_tosld_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 6:
          gen_helper_vfp_touhd_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
          break;
        case 7:
          gen_helper_vfp_tould_round_to_zero(tcg_ctx_00,var,var,arg2,arg3);
          break;
        default:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                     ,0xaf5,(char *)0x0);
        }
        neon_store_reg64(tcg_ctx_00,var,a->vd);
        tcg_temp_free_i64(tcg_ctx_00,var);
        tcg_temp_free_i32(tcg_ctx_00,arg2);
        tcg_temp_free_ptr(tcg_ctx_00,arg3);
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_fix_dp(DisasContext *s, arg_VCVT_fix_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd;
    TCGv_i32 shift;
    TCGv_ptr fpst;
    int frac_bits;

    if (!dc_isar_feature(aa32_fpdp_v3, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    frac_bits = (a->opc & 1) ? (32 - a->imm) : (16 - a->imm);

    vd = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg64(tcg_ctx, vd, a->vd);

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    shift = tcg_const_i32(tcg_ctx, frac_bits);

    /* Switch on op:U:sx bits */
    switch (a->opc) {
    case 0:
        gen_helper_vfp_shtod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 1:
        gen_helper_vfp_sltod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 2:
        gen_helper_vfp_uhtod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 3:
        gen_helper_vfp_ultod(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 4:
        gen_helper_vfp_toshd_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 5:
        gen_helper_vfp_tosld_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 6:
        gen_helper_vfp_touhd_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 7:
        gen_helper_vfp_tould_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i64(tcg_ctx, vd);
    tcg_temp_free_i32(tcg_ctx, shift);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}